

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity
          (Vector<capnp::_::RawBrandedSchema::Dependency> *this,size_t newSize)

{
  Dependency *pDVar1;
  Dependency *__dest;
  size_t __n;
  ArrayBuilder<capnp::_::RawBrandedSchema::Dependency> local_38;
  
  pDVar1 = (this->builder).ptr;
  if (newSize < (ulong)((long)(this->builder).pos - (long)pDVar1 >> 4)) {
    (this->builder).pos = pDVar1 + newSize;
  }
  __dest = _::HeapArrayDisposer::allocateUninitialized<capnp::_::RawBrandedSchema::Dependency>
                     (newSize);
  local_38.endPtr = __dest + newSize;
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pDVar1 = (this->builder).ptr;
  __n = (long)(this->builder).pos - (long)pDVar1;
  local_38.ptr = __dest;
  if (__n != 0) {
    memcpy(__dest,pDVar1,__n);
  }
  local_38.pos = (RemoveConst<capnp::_::RawBrandedSchema::Dependency> *)((long)__dest + __n);
  ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::operator=(&this->builder,&local_38);
  ArrayBuilder<capnp::_::RawBrandedSchema::Dependency>::dispose(&local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }